

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

any * __thiscall
Omega_h::InputYamlReader::map_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *key_any,any *value_any)

{
  _func_int **pp_Var1;
  char *pcVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  type_info *ptVar6;
  InputList *this_00;
  InputScalar *this_01;
  InputMap *this_02;
  undefined8 *puVar7;
  ParserFail *this_03;
  InputMap value;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
  _Stack_88;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  __shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_50 = 0;
  local_48 = 0;
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = &local_48;
  bVar4 = any::is_typed(key_any,(type_info *)&std::__cxx11::string::typeinfo);
  if ((!bVar4) || ((string *)(key_any->storage).dynamic == (string *)0x0)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__bad_cast_004b86a8;
    __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  std::__cxx11::string::operator=((string *)&local_58,(string *)(key_any->storage).dynamic);
  if (value_any->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*value_any->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar6 + 8);
  if ((pcVar2 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
     ((*pcVar2 != '*' &&
      (iVar5 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar5 == 0))))
  {
    bVar4 = any::is_typed(value_any,(type_info *)&std::__cxx11::string::typeinfo);
    if ((!bVar4) || (plVar3 = (long *)(value_any->storage).dynamic, plVar3 == (long *)0x0)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pp_Var1 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var1) {
      local_90 = (undefined1  [8])*pp_Var1;
      _Stack_88._M_impl._0_8_ = plVar3[3];
      local_a0._0_8_ = local_90;
    }
    else {
      local_90 = (undefined1  [8])*pp_Var1;
      local_a0._0_8_ = (_func_int **)*plVar3;
    }
    local_a0._8_8_ = plVar3[1];
    *plVar3 = (long)pp_Var1;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    this_01 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar(this_01,(string *)local_a0);
    std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputScalar>
              (&local_38,this_01);
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)((long)local_90 + 1));
    }
  }
  else {
    if (value_any->vtable == (vtable_type *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar6 = (*value_any->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar6 + 8);
    if ((pcVar2 == "N7Omega_h9InputListE") ||
       ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,"N7Omega_h9InputListE"), iVar5 == 0)))) {
      bVar4 = any::is_typed(value_any,(type_info *)&InputList::typeinfo);
      if ((!bVar4) || ((InputList *)(value_any->storage).dynamic == (InputList *)0x0)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      InputList::InputList((InputList *)local_a0,(InputList *)(value_any->storage).dynamic);
      this_00 = (InputList *)operator_new(0x30);
      InputList::InputList(this_00,(InputList *)local_a0);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputList>
                (&local_38,this_00);
      local_a0._0_8_ = &PTR__InputList_004b9870;
      std::
      vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>::
      ~vector((vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
               *)(local_90 + 8));
    }
    else {
      if (value_any->vtable == (vtable_type *)0x0) {
        ptVar6 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar6 = (*value_any->vtable->type)();
      }
      pcVar2 = *(char **)(ptVar6 + 8);
      if ((pcVar2 != "N7Omega_h8InputMapE") &&
         ((*pcVar2 == '*' || (iVar5 = strcmp(pcVar2,"N7Omega_h8InputMapE"), iVar5 != 0)))) {
        local_a0._0_8_ = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"unexpected YAML map value type ","");
        if (value_any->vtable != (vtable_type *)0x0) {
          (*value_any->vtable->type)();
        }
        std::__cxx11::string::append(local_a0);
        std::__cxx11::string::append(local_a0);
        std::__cxx11::string::_M_append(local_a0,(ulong)local_58);
        std::__cxx11::string::append(local_a0);
        this_03 = (ParserFail *)__cxa_allocate_exception(0x10);
        ParserFail::ParserFail(this_03,(string *)local_a0);
        __cxa_throw(this_03,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      bVar4 = any::is_typed(value_any,(type_info *)&InputMap::typeinfo);
      if ((!bVar4) || ((InputMap *)(value_any->storage).dynamic == (InputMap *)0x0)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      InputMap::InputMap((InputMap *)local_a0,(InputMap *)(value_any->storage).dynamic);
      this_02 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(this_02,(InputMap *)local_a0);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputMap>
                (&local_38,this_02);
      local_a0._0_8_ = &PTR__InputMap_004b9848;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
                   *)(local_90 + 8));
    }
  }
  __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::NameValue>()::table;
  puVar7 = (undefined8 *)operator_new(0x30);
  *puVar7 = puVar7 + 2;
  if (local_58 == &local_48) {
    puVar7[2] = CONCAT71(uStack_47,local_48);
    puVar7[3] = uStack_40;
  }
  else {
    *puVar7 = local_58;
    puVar7[2] = CONCAT71(uStack_47,local_48);
  }
  puVar7[1] = local_50;
  puVar7[4] = local_38._M_ptr;
  puVar7[5] = local_38._M_refcount._M_pi;
  (__return_storage_ptr__->storage).dynamic = puVar7;
  return __return_storage_ptr__;
}

Assistant:

any map_item(any& key_any, any& value_any) {
    NameValue result;
    result.name = any_cast<std::string&&>(std::move(key_any));
    if (value_any.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(value_any));
      result.value.reset(new InputScalar(value));
    } else if (value_any.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(value_any));
      result.value.reset(new InputList(std::move(value)));
    } else if (value_any.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(value_any));
      result.value.reset(new InputMap(std::move(value)));
    } else {
      std::string msg = "unexpected YAML map value type ";
      msg += value_any.type().name();
      msg += " for name \"";
      msg += result.name;
      msg += "\"\n";
      throw ParserFail(msg);
    }
    return any(std::move(result));
  }